

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O3

int fill_inbuf(int eof_ok)

{
  size_t sVar1;
  
  insize = 0;
  do {
    sVar1 = fread(inbuf + insize,1,(ulong)(0x8000 - insize),(FILE *)ifd);
    if ((int)sVar1 + 1U < 2) {
      if (insize == 0) {
        ffpmsg(ifname);
        ffpmsg("unexpected end of file");
        return 1;
      }
      break;
    }
    insize = insize + (int)sVar1;
  } while (insize < 0x8000);
  bytes_in = bytes_in + (ulong)insize;
  inptr = 1;
  return (uint)inbuf[0];
}

Assistant:

local int fill_inbuf(int eof_ok)
         /* set if EOF acceptable as a result */
{
    int len;

      /* Read as much as possible from file */
      insize = 0;
      do {
        len = fread((char*)inbuf+insize, 1, INBUFSIZ-insize, ifd);
        if (len == 0 || len == EOF) break;
	insize += len;
      } while (insize < INBUFSIZ);

    if (insize == 0) {
	if (eof_ok) return EOF;
	error("unexpected end of file");
        exit_code = ERROR;
        return ERROR;
    }

    bytes_in += (ulg)insize;
    inptr = 1;
    return inbuf[0];
}